

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void iadst8x8_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  __m256i alVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  __m256i in0;
  __m256i in1;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar9 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x170);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x250);
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar10._16_4_ = uVar1;
  auVar10._20_4_ = uVar1;
  auVar10._24_4_ = uVar1;
  auVar10._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x1a0);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar13._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x220);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15._16_4_ = uVar1;
  auVar15._20_4_ = uVar1;
  auVar15._24_4_ = uVar1;
  auVar15._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x1e0);
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar12._16_4_ = uVar1;
  auVar12._20_4_ = uVar1;
  auVar12._24_4_ = uVar1;
  auVar12._28_4_ = uVar1;
  iVar8 = 1 << ((char)bit - 1U & 0x1f);
  auVar16._4_4_ = iVar8;
  auVar16._0_4_ = iVar8;
  auVar16._8_4_ = iVar8;
  auVar16._12_4_ = iVar8;
  auVar16._16_4_ = iVar8;
  auVar16._20_4_ = iVar8;
  auVar16._24_4_ = iVar8;
  auVar16._28_4_ = iVar8;
  auVar10 = vpmulld_avx2((undefined1  [32])*in,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar16);
  alVar2 = (__m256i)vpsrad_avx2(auVar10,ZEXT416((uint)bit));
  auVar10 = vpmulld_avx2((undefined1  [32])*in,auVar11);
  auVar10 = vpsubd_avx2(auVar16,auVar10);
  auVar3 = vpsrad_avx2(auVar10,ZEXT416((uint)bit));
  auVar10 = vpmulld_avx2((undefined1  [32])alVar2,auVar13);
  auVar11 = vpmulld_avx2(auVar3,auVar15);
  auVar10 = vpaddd_avx2(auVar10,auVar16);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  auVar14 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar10,auVar14);
  auVar10 = vpmulld_avx2((undefined1  [32])alVar2,auVar15);
  auVar11 = vpmulld_avx2(auVar13,auVar3);
  auVar10 = vpaddd_avx2(auVar10,auVar16);
  auVar10 = vpsubd_avx2(auVar10,auVar11);
  alVar5 = (__m256i)vpsrad_avx2(auVar10,auVar14);
  auVar10 = vpmulld_avx2((undefined1  [32])alVar2,auVar12);
  auVar13 = vpmulld_avx2(auVar3,auVar12);
  auVar10 = vpaddd_avx2(auVar10,auVar16);
  auVar11 = vpaddd_avx2(auVar10,auVar13);
  in1 = (__m256i)vpsrad_avx2(auVar11,auVar14);
  auVar10 = vpsubd_avx2(auVar10,auVar13);
  alVar6 = (__m256i)vpsrad_avx2(auVar10,auVar14);
  auVar10 = vpmulld_avx2(auVar4,auVar12);
  auVar13 = vpmulld_avx2((undefined1  [32])alVar5,auVar12);
  auVar10 = vpaddd_avx2(auVar10,auVar16);
  auVar11 = vpaddd_avx2(auVar10,auVar13);
  in0 = (__m256i)vpsrad_avx2(auVar11,ZEXT416((uint)bit));
  auVar10 = vpsubd_avx2(auVar10,auVar13);
  auVar10 = vpsrad_avx2(auVar10,ZEXT416((uint)bit));
  if (do_cols == 0) {
    bVar7 = 10;
    if (10 < bd) {
      bVar7 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar7 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    neg_shift_avx2(in0,in1,out,out + 1,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 2,out + 3,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 4,out + 5,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
    neg_shift_avx2(in0,in1,out + 6,out + 7,(__m256i *)&local_80,(__m256i *)&local_a0,out_shift);
  }
  else {
    *out = alVar2;
    auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar2 = (__m256i)vpsubd_avx2(auVar11,auVar4);
    out[1] = alVar2;
    out[2] = in0;
    alVar2 = (__m256i)vpsubd_avx2(auVar11,(undefined1  [32])in1);
    out[3] = alVar2;
    out[4] = alVar6;
    alVar2 = (__m256i)vpsubd_avx2(auVar11,auVar10);
    out[5] = alVar2;
    out[6] = alVar5;
    alVar2 = (__m256i)vpsubd_avx2(auVar11,auVar3);
    out[7] = alVar2;
  }
  return;
}

Assistant:

static void iadst8x8_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i kZero = _mm256_setzero_si256();
  __m256i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm256_mullo_epi32(in[0], cospi60);
  u[0] = _mm256_add_epi32(x, rnding);
  u[0] = _mm256_srai_epi32(u[0], bit);

  x = _mm256_mullo_epi32(in[0], cospi4);
  u[1] = _mm256_sub_epi32(kZero, x);
  u[1] = _mm256_add_epi32(u[1], rnding);
  u[1] = _mm256_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m256i temp1, temp2;
  temp1 = _mm256_mullo_epi32(u[0], cospi16);
  x = _mm256_mullo_epi32(u[1], cospi48);
  temp1 = _mm256_add_epi32(temp1, x);
  temp1 = _mm256_add_epi32(temp1, rnding);
  temp1 = _mm256_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm256_mullo_epi32(u[0], cospi48);
  x = _mm256_mullo_epi32(u[1], cospi16);
  u[5] = _mm256_sub_epi32(temp2, x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm256_mullo_epi32(u[0], cospi32);
  x = _mm256_mullo_epi32(u[1], cospi32);
  u[2] = _mm256_add_epi32(temp1, x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_sub_epi32(temp1, x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  temp1 = _mm256_mullo_epi32(u[4], cospi32);
  x = _mm256_mullo_epi32(u[5], cospi32);
  u[6] = _mm256_add_epi32(temp1, x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_sub_epi32(temp1, x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm256_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm256_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm256_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm256_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_avx2(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
  }
}